

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O1

JavascriptString * __thiscall
Js::StringCache::InitializeString<true,9ul>(StringCache *this,char16 (*value) [9])

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyString *pPVar4;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  local_20 = (PropertyRecord *)0x0;
  ScriptContext::FindPropertyRecord((this->scriptContext).ptr,*value,8,&local_20);
  if (local_20 == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x43,"(propertyRecord != nullptr)",
                                "Trying to create a propertystring for non property string?");
    if (!bVar2) goto LAB_003a6489;
    *puVar3 = 0;
  }
  if (0x2d8 < local_20->pid) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x44,"(IsBuiltInPropertyId(propertyRecord->GetPropertyId()))",
                                "IsBuiltInPropertyId(propertyRecord->GetPropertyId())");
    if (!bVar2) {
LAB_003a6489:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = ScriptContext::GetPropertyString((this->scriptContext).ptr,local_20->pid);
  return &pPVar4->super_JavascriptString;
}

Assistant:

JavascriptString* InitializeString(const char16(&value)[N]) const
    {
        if (withPropertyString)
        {
            const PropertyRecord* propertyRecord = nullptr;
            scriptContext->FindPropertyRecord(value, N - 1, &propertyRecord);
            AssertMsg(propertyRecord != nullptr, "Trying to create a propertystring for non property string?");
            Assert(IsBuiltInPropertyId(propertyRecord->GetPropertyId()));
            return scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        else
        {
            return LiteralString::New(stringTypeStatic, value, N - 1 /*don't include terminating NUL*/, scriptContext->GetRecycler());
        }
    }